

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O1

void pubkeyExceptionTest(string *hex)

{
  ByteData BVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar2;
  bool bVar3;
  Pubkey pubkey;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar4;
  pointer in_stack_ffffffffffffffa0;
  pointer puVar5;
  pointer in_stack_ffffffffffffffa8;
  pointer puVar6;
  AssertHelper local_48;
  Pubkey local_40;
  ByteData local_28;
  
  cfd::core::Pubkey::Pubkey(&local_40);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xffffffffffffff98,(string *)hex);
    sVar4.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    puVar5 = (pointer)0x0;
    puVar6 = (pointer)0x0;
    sVar2.ptr_ = in_stack_ffffffffffffff98.ptr_;
    local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_ffffffffffffffa0;
    local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffa8;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar2.ptr_ = in_stack_ffffffffffffff98.ptr_;
      operator_delete(local_40.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)sVar2.ptr_;
      sVar2.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_40.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    }
    local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)sVar2.ptr_;
    in_stack_ffffffffffffffa8 = puVar6;
    in_stack_ffffffffffffffa0 = puVar5;
    in_stack_ffffffffffffff98.ptr_ = sVar4.ptr_;
    if (in_stack_ffffffffffffff98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(in_stack_ffffffffffffff98.ptr_);
    }
  }
  testing::Message::Message((Message *)&stack0xffffffffffffff98);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_pubkey.cpp"
             ,99,
             "Expected: (pubkey = Pubkey(hex)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&stack0xffffffffffffff98);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (in_stack_ffffffffffffff98.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (in_stack_ffffffffffffff98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98.ptr_ + 8))();
    }
    in_stack_ffffffffffffff98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::core::ByteData::ByteData(&local_28,(string *)hex);
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_ffffffffffffffa0;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff98.ptr_;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffa8;
    cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xffffffffffffff98,BVar1);
    puVar5 = local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar4.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar3 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff98.ptr_;
    local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_ffffffffffffffa0;
    local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffa8;
    if (bVar3) {
      operator_delete(puVar5);
    }
    in_stack_ffffffffffffff98.ptr_ = sVar4.ptr_;
    if (in_stack_ffffffffffffff98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(in_stack_ffffffffffffff98.ptr_);
    }
    if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&stack0xffffffffffffff98);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_pubkey.cpp"
             ,100,
             "Expected: (pubkey = Pubkey(ByteData(hex))) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&stack0xffffffffffffff98);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (((in_stack_ffffffffffffff98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
     (in_stack_ffffffffffffff98.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)in_stack_ffffffffffffff98.ptr_ + 8))();
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_40.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void pubkeyExceptionTest(std::string hex) {
  Pubkey pubkey;
  EXPECT_THROW((pubkey = Pubkey(hex)), CfdException);
  EXPECT_THROW((pubkey = Pubkey(ByteData(hex))), CfdException);
}